

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::TSPI_PDU::SetSystemSpecificData(TSPI_PDU *this,KOCTET *Data,KUINT8 Length)

{
  KUINT16 *pKVar1;
  pointer *ppcVar2;
  pointer pcVar3;
  pointer pcVar4;
  iterator __position;
  KUINT16 KVar5;
  ulong uVar6;
  
  pcVar3 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  KVar5 = ((short)pcVar3 - (short)pcVar4) +
          (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar5;
  if (pcVar3 != pcVar4) {
    (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 0x40) == 0) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag | 0x40;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = KVar5 + 1;
  }
  if ((this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar3) {
    (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
  }
  uVar6 = (ulong)Length;
  if (Length != '\0') {
    do {
      __position._M_current =
           (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)&this->m_vSSD,__position,Data);
      }
      else {
        *__position._M_current = *Data;
        ppcVar2 = &(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar2 = *ppcVar2 + 1;
      }
      Data = Data + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  this->m_ui8SSDLen = Length;
  pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (ushort)Length;
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificData( const KOCTET * Data, KUINT8 Length )
{
    ClearSystemSpecificData();
    SetSystemSpecificDataFlag( true );
    m_vSSD.clear();

    for( KUINT8 i = 0; i < Length; ++i )
    {
        m_vSSD.push_back( Data[i] );
    }

    m_ui8SSDLen = Length;

    // Set the new pdu length
    m_ui16PDULength += Length;
}